

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int luaopen_jit(lua_State *L)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint32_t features [4];
  uint32_t vendor [4];
  undefined1 auStack_58 [8];
  uint local_50;
  uint local_48 [4];
  undefined1 local_38 [4];
  uint local_34;
  
  uVar3 = (ulong)(L->glref).ptr32;
  iVar1 = lj_vm_cpuid(0,local_48);
  uVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = lj_vm_cpuid(1,auStack_58);
    uVar2 = 0;
    if ((iVar1 != 0) && (uVar2 = local_50 >> 0xe & 0x20 | (local_50 & 1) << 4, 6 < local_48[0])) {
      lj_vm_cpuid(7,local_38);
      uVar2 = uVar2 | local_34 >> 2 & 0x40;
    }
  }
  *(uint *)(uVar3 + 0x2d8) = uVar2 | 0x3ff0001;
  ((int32_t *)(uVar3 + 0x88c))[0] = 1000;
  ((int32_t *)(uVar3 + 0x88c))[1] = 4000;
  ((int32_t *)(uVar3 + 0x894))[0] = 500;
  ((int32_t *)(uVar3 + 0x894))[1] = 100;
  ((int32_t *)(uVar3 + 0x89c))[0] = 500;
  ((int32_t *)(uVar3 + 0x89c))[1] = 0;
  ((int32_t *)(uVar3 + 0x8a4))[0] = 0x38;
  ((int32_t *)(uVar3 + 0x8a4))[1] = 10;
  ((int32_t *)(uVar3 + 0x8ac))[0] = 4;
  ((int32_t *)(uVar3 + 0x8ac))[1] = 4;
  ((int32_t *)(uVar3 + 0x8b4))[0] = 0xf;
  ((int32_t *)(uVar3 + 0x8b4))[1] = 3;
  ((int32_t *)(uVar3 + 0x8b8))[0] = 3;
  ((int32_t *)(uVar3 + 0x8b8))[1] = 2;
  ((int32_t *)(uVar3 + 0x8c0))[0] = 0x40;
  ((int32_t *)(uVar3 + 0x8c0))[1] = 0x200;
  lj_dispatch_update((global_State *)(ulong)(L->glref).ptr32);
  lua_pushlstring(L,"Linux",5);
  lua_pushlstring(L,"x64",3);
  lua_pushinteger(L,0x4e84);
  lua_pushlstring(L,"LuaJIT 2.1.0-beta3",0x12);
  lj_lib_register(L,"jit",lj_lib_init_jit,lj_lib_cf_jit);
  lj_lib_prereg(L,"jit.profile",luaopen_jit_profile,(GCtab *)(ulong)(L->env).gcptr32);
  lj_lib_prereg(L,"jit.util",luaopen_jit_util,(GCtab *)(ulong)(L->env).gcptr32);
  lj_lib_register(L,"jit.opt",lj_lib_init_jit_opt,lj_lib_cf_jit_opt);
  L->top = L->top + -2;
  return 1;
}

Assistant:

LUALIB_API int luaopen_jit(lua_State *L)
{
#if LJ_HASJIT
  jit_init(L);
#endif
  lua_pushliteral(L, LJ_OS_NAME);
  lua_pushliteral(L, LJ_ARCH_NAME);
  lua_pushinteger(L, LUAJIT_VERSION_NUM);
  lua_pushliteral(L, LUAJIT_VERSION);
  LJ_LIB_REG(L, LUA_JITLIBNAME, jit);
#if LJ_HASPROFILE
  lj_lib_prereg(L, LUA_JITLIBNAME ".profile", luaopen_jit_profile,
		tabref(L->env));
#endif
#ifndef LUAJIT_DISABLE_JITUTIL
  lj_lib_prereg(L, LUA_JITLIBNAME ".util", luaopen_jit_util, tabref(L->env));
#endif
#if LJ_HASJIT
  LJ_LIB_REG(L, "jit.opt", jit_opt);
#endif
  L->top -= 2;
  return 1;
}